

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_bless(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  if (target == 1) {
    txt = "Uh, what are you thinking?\n\r";
  }
  else {
    if (*(short *)((long)vo + 0x1f8) != 7) {
      bVar1 = is_affected((CHAR_DATA *)vo,sn);
      if (!bVar1) {
        init_affect(&local_90);
        local_90.where = 0;
        local_90.level = (short)level;
        local_90.duration = local_90.level + 6;
        local_90.location = 0x12;
        local_90.aftype = 4;
        sVar2 = (short)((uint)level >> 3);
        local_90.modifier = 1;
        if (7 < level) {
          local_90.modifier = sVar2;
        }
        sVar3 = -1;
        if (7 < level) {
          sVar3 = -sVar2;
        }
        local_90.type = (short)sn;
        affect_to_char((CHAR_DATA *)vo,&local_90);
        local_90.location = 0x19;
        local_90.modifier = sVar3;
        affect_to_char((CHAR_DATA *)vo,&local_90);
        send_to_char("You feel righteous.\n\r",(CHAR_DATA *)vo);
        if (ch != (CHAR_DATA *)vo) {
          act("You grant $N the favor of your god.",ch,(void *)0x0,vo,3);
        }
        return;
      }
    }
    if ((CHAR_DATA *)vo != ch) {
      act("$N already has divine favor.",ch,(void *)0x0,vo,3);
      return;
    }
    txt = "You are already blessed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_bless(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;

	if (target == TARGET_OBJ)
	{
		send_to_char("Uh, what are you thinking?\n\r", ch);
		return;
	}

	/* character target */
	victim = (CHAR_DATA *)vo;

	if (victim->position == POS_FIGHTING || is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already blessed.\n\r", ch);
		else
			act("$N already has divine favor.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = 6 + level;
	af.location = APPLY_HITROLL;
	af.aftype = AFT_COMMUNE;

	if (level < 8)
		af.modifier = 1;
	else
		af.modifier = level / 8;

	affect_to_char(victim, &af);

	af.location = APPLY_SAVING_SPELL;

	if (level < 8)
		af.modifier = -1;
	else
		af.modifier = 0 - level / 8;

	affect_to_char(victim, &af);
	send_to_char("You feel righteous.\n\r", victim);

	if (ch != victim)
		act("You grant $N the favor of your god.", ch, nullptr, victim, TO_CHAR);
}